

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::MaskConstancyCase::init
          (MaskConstancyCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  long lStack_18;
  GLint maxSampleMaskWords;
  Functions *gl;
  MaskConstancyCase *this_local;
  
  gl = (Functions *)this;
  pRVar2 = Context::getRenderContext
                     ((this->super_DefaultFBOMultisampleCase).super_TestCase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar1);
  if (((this->super_DefaultFBOMultisampleCase).field_0xb4 & 1) != 0) {
    local_1c = 0;
    ctx = (EVP_PKEY_CTX *)&local_1c;
    (**(code **)(lStack_18 + 0x868))(0x8e59);
    iVar1 = getEffectiveSampleMaskWordCount
                      ((this->super_DefaultFBOMultisampleCase).m_numSamples + -1);
    if (local_1c < iVar1) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Test requires larger GL_MAX_SAMPLE_MASK_WORDS",&local_41);
      tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  iVar1 = DefaultFBOMultisampleCase::init(&this->super_DefaultFBOMultisampleCase,ctx);
  return iVar1;
}

Assistant:

void MaskConstancyCase::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// check the test is even possible
	if (m_isSampleMaskCase)
	{
		GLint maxSampleMaskWords = 0;
		gl.getIntegerv(GL_MAX_SAMPLE_MASK_WORDS, &maxSampleMaskWords);
		if (getEffectiveSampleMaskWordCount(m_numSamples - 1) > maxSampleMaskWords)
			throw tcu::NotSupportedError("Test requires larger GL_MAX_SAMPLE_MASK_WORDS");
	}

	// normal init
	DefaultFBOMultisampleCase::init();
}